

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallScriptGenerator::AddScriptInstallRule
          (cmInstallScriptGenerator *this,ostream *os,Indent indent,string *script)

{
  ostream *poVar1;
  string *script_local;
  ostream *os_local;
  cmInstallScriptGenerator *this_local;
  Indent indent_local;
  
  if ((this->Code & 1U) == 0) {
    poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"include(\"");
    poVar1 = std::operator<<(poVar1,(string *)script);
    std::operator<<(poVar1,"\")\n");
  }
  else {
    poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,(string *)script);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void cmInstallScriptGenerator::AddScriptInstallRule(std::ostream& os,
                                                    Indent indent,
                                                    std::string const& script)
{
  if (this->Code) {
    os << indent << script << "\n";
  } else {
    os << indent << "include(\"" << script << "\")\n";
  }
}